

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill.cpp
# Opt level: O0

int main(void)

{
  undefined8 uVar1;
  bool bVar2;
  _Ios_Iostate __a;
  exception *e;
  string local_e8;
  undefined1 local_c8 [8];
  vector<Point,_std::allocator<Point>_> processed_points;
  string local_a8;
  undefined1 local_88 [8];
  vector<Point,_std::allocator<Point>_> original_points;
  string local_68;
  allocator<char> local_31;
  string local_30;
  int local_c;
  
  local_c = 0;
  uVar1 = *(undefined8 *)(std::cin + -0x18);
  __a = std::ios::exceptions();
  std::operator|(__a,_S_badbit);
  std::ios::exceptions((int)uVar1 + 0x10a1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Enter 7 points. To terminate the input enter semicolon (;).",
             &local_31);
  prompt_for_input(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Example: (2 5) (3 5);",
             (allocator<char> *)
             ((long)&original_points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  prompt_for_input(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&original_points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  get_points((vector<Point,_std::allocator<Point>_> *)local_88,(istream *)&std::cin);
  print_points((vector<Point,_std::allocator<Point>_> *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"mydata.txt",
             (allocator<char> *)
             ((long)&processed_points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  write_points_to_file(&local_a8,(vector<Point,_std::allocator<Point>_> *)local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&processed_points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"mydata.txt",(allocator<char> *)((long)&e + 7));
  read_points_from_file((vector<Point,_std::allocator<Point>_> *)local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  print_points((vector<Point,_std::allocator<Point>_> *)local_c8);
  bVar2 = are_set_equals((vector<Point,_std::allocator<Point>_> *)local_88,
                         (vector<Point,_std::allocator<Point>_> *)local_c8);
  if (!bVar2) {
    std::operator<<((ostream *)&std::cerr,"Something\'s wrong!\n");
  }
  std::vector<Point,_std::allocator<Point>_>::~vector
            ((vector<Point,_std::allocator<Point>_> *)local_c8);
  std::vector<Point,_std::allocator<Point>_>::~vector
            ((vector<Point,_std::allocator<Point>_> *)local_88);
  return local_c;
}

Assistant:

int main()
{
	std::cin.exceptions(std::cin.exceptions() | std::ios_base::badbit);
	prompt_for_input("Enter 7 points. To terminate the input enter semicolon (;).");
	prompt_for_input("Example: (2 5) (3 5);");
	try
	{
		std::vector<Point> original_points = get_points(std::cin);
		print_points(original_points);
		write_points_to_file("mydata.txt", original_points);
		auto processed_points = read_points_from_file("mydata.txt");
		print_points(processed_points);
		if (!are_set_equals(original_points, processed_points))
		{
			std::cerr << "Something's wrong!\n";
		}
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
	
}